

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearch.hpp
# Opt level: O2

void __thiscall QuantLib::LineSearch::~LineSearch(LineSearch *this)

{
  this->_vptr_LineSearch = (_func_int **)&PTR__LineSearch_002cc230;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->gradient_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->xtd_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->searchDirection_);
  return;
}

Assistant:

virtual ~LineSearch() {}